

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtMan.c
# Opt level: O1

void Cgt_ManClean(Cgt_Man_t *p)

{
  Vec_Ptr_t *__ptr;
  
  if (p->pPart != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pPart);
    p->pPart = (Aig_Man_t *)0x0;
  }
  if (p->pCnf != (Cnf_Dat_t *)0x0) {
    Cnf_DataFree(p->pCnf);
    p->pCnf = (Cnf_Dat_t *)0x0;
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
    p->pSat = (sat_solver *)0x0;
  }
  __ptr = p->vPatts;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
    p->vPatts = (Vec_Ptr_t *)0x0;
  }
  return;
}

Assistant:

void Cgt_ManClean( Cgt_Man_t * p )
{
    if ( p->pPart )
    {
        Aig_ManStop( p->pPart );
        p->pPart = NULL;
    }
    if ( p->pCnf )
    {
        Cnf_DataFree( p->pCnf );
        p->pCnf = NULL;
    }
    if ( p->pSat )
    {
        sat_solver_delete( p->pSat );
        p->pSat = NULL;
    }
    if ( p->vPatts )
    {
        Vec_PtrFree( p->vPatts );
        p->vPatts = NULL;
    }
}